

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerGLSL::flattened_access_chain_struct_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,uint32_t base,uint32_t *indices,
          uint32_t count,SPIRType *target_type,uint32_t offset)

{
  uint uVar1;
  uint32_t uVar2;
  uint32_t matrix_stride;
  SPIRType *target_type_00;
  bool need_transpose;
  uint32_t index;
  ulong uVar3;
  string tmp;
  uint32_t in_stack_ffffffffffffff18;
  Bitset local_b8;
  uint32_t *local_78;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_78 = indices;
  if ((this->backend).can_declare_struct_inline == true) {
    type_to_glsl_constructor_abi_cxx11_((string *)&local_b8,this,target_type);
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,CONCAT44(local_b8.lower._4_4_,(uint)local_b8.lower));
    if ((size_type *)CONCAT44(local_b8.lower._4_4_,(uint)local_b8.lower) !=
        &local_b8.higher._M_h._M_bucket_count) {
      operator_delete((undefined1 *)CONCAT44(local_b8.lower._4_4_,(uint)local_b8.lower));
    }
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  if ((int)(target_type->member_types).
           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size != 0) {
    uVar3 = 0;
    do {
      if (uVar3 != 0) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      target_type_00 =
           Variant::get<spirv_cross::SPIRType>
                     ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                      (target_type->member_types).
                      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[uVar3].id);
      index = (uint32_t)uVar3;
      uVar2 = Compiler::type_struct_member_offset(&this->super_Compiler,target_type,index);
      need_transpose = false;
      matrix_stride = 0;
      if (1 < target_type_00->columns) {
        Compiler::combined_decoration_for_member(&local_b8,&this->super_Compiler,target_type,index);
        uVar1 = (uint)local_b8.lower;
        ::std::
        _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable(&local_b8.higher._M_h);
        matrix_stride =
             Compiler::type_struct_member_matrix_stride(&this->super_Compiler,target_type,index);
        need_transpose = SUB41((uVar1 & 0x10) >> 4,0);
      }
      flattened_access_chain_abi_cxx11_
                ((string *)&local_b8,this,base,local_78,count,target_type_00,uVar2 + offset,
                 matrix_stride,in_stack_ffffffffffffff18,need_transpose);
      if (need_transpose == false) {
        ::std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,
                   CONCAT44(local_b8.lower._4_4_,(uint)local_b8.lower));
      }
      else {
        local_70[0] = local_60;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_70,CONCAT44(local_b8.lower._4_4_,(uint)local_b8.lower),
                   (long)local_b8.higher._M_h._M_buckets +
                   CONCAT44(local_b8.lower._4_4_,(uint)local_b8.lower));
        (*(this->super_Compiler)._vptr_Compiler[0x29])
                  (local_50,this,(string *)local_70,target_type_00,0,0);
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50[0]);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
        if (local_70[0] != local_60) {
          operator_delete(local_70[0]);
        }
      }
      if ((size_type *)CONCAT44(local_b8.lower._4_4_,(uint)local_b8.lower) !=
          &local_b8.higher._M_h._M_bucket_count) {
        operator_delete((undefined1 *)CONCAT44(local_b8.lower._4_4_,(uint)local_b8.lower));
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < (uint)(target_type->member_types).
                           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                           buffer_size);
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string CompilerGLSL::flattened_access_chain_struct(uint32_t base, const uint32_t *indices, uint32_t count,
                                                        const SPIRType &target_type, uint32_t offset)
{
	std::string expr;

	if (backend.can_declare_struct_inline)
	{
		expr += type_to_glsl_constructor(target_type);
		expr += "(";
	}
	else
		expr += "{";

	for (uint32_t i = 0; i < uint32_t(target_type.member_types.size()); ++i)
	{
		if (i != 0)
			expr += ", ";

		const SPIRType &member_type = get<SPIRType>(target_type.member_types[i]);
		uint32_t member_offset = type_struct_member_offset(target_type, i);

		// The access chain terminates at the struct, so we need to find matrix strides and row-major information
		// ahead of time.
		bool need_transpose = false;
		uint32_t matrix_stride = 0;
		if (member_type.columns > 1)
		{
			need_transpose = combined_decoration_for_member(target_type, i).get(DecorationRowMajor);
			matrix_stride = type_struct_member_matrix_stride(target_type, i);
		}

		auto tmp = flattened_access_chain(base, indices, count, member_type, offset + member_offset, matrix_stride,
		                                  0 /* array_stride */, need_transpose);

		// Cannot forward transpositions, so resolve them here.
		if (need_transpose)
			expr += convert_row_major_matrix(tmp, member_type, 0, false);
		else
			expr += tmp;
	}

	expr += backend.can_declare_struct_inline ? ")" : "}";

	return expr;
}